

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
slang::CommandLine::handlePlusArg
          (CommandLine *this,string_view arg,ParseOptions options,bool *hadUnknowns)

{
  Option *this_00;
  undefined1 auVar1 [16];
  byte bVar2;
  void *pvVar3;
  iterator iVar4;
  ulong uVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 __s;
  size_type __n;
  ulong __n_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar9;
  string_view name;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view name_00;
  string_view value;
  format_args args;
  format_args args_00;
  format_args args_01;
  string result_1;
  string result;
  string local_a8;
  key_type local_88;
  Option *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)arg._M_str;
  __n_00 = arg._M_len;
  local_68 = (Option *)CONCAT44(local_68._4_4_,options);
  uVar6 = 0xffffffffffffffff;
  if (2 < __n_00) {
    pvVar3 = memchr(paVar7->_M_local_buf + 2,0x2b,__n_00 - 2);
    uVar6 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)paVar7;
  }
  if (uVar6 == 0xffffffffffffffff) {
    __s.values_ = (value<fmt::v11::context> *)0x0;
    uVar5 = 0;
    uVar6 = __n_00;
  }
  else {
    lVar8 = uVar6 + 1;
    if (__n_00 <= uVar6) {
LAB_001e3e98:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar8,__n_00);
    }
    __s.values_ = (value<fmt::v11::context> *)(paVar7->_M_local_buf + lVar8);
    uVar5 = __n_00 - lVar8;
  }
  __n_00 = uVar5;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,paVar7,paVar7->_M_local_buf + uVar6);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
          ::find(&(this->optionMap)._M_t,&local_88);
  local_60 = paVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,(size_t)(local_88.field_2._M_allocated_capacity + 1));
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(this->optionMap)._M_t._M_impl.super__Rb_tree_header) {
    *hadUnknowns = true;
    local_88._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
    local_88._M_string_length = (this->programName)._M_string_length;
    local_88.field_2._M_allocated_capacity = (size_type)local_60;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x26;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_88;
    local_88.field_2._8_8_ = uVar6;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_a8,(v11 *)"{}: unknown command line argument \'{}\'",fmt_00,args_00);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_a8);
  }
  else {
    this_00 = *(Option **)(iVar4._M_node + 2);
    bVar2 = (byte)((ulong)local_68 >> 0x18);
    if (__n_00 != 0) {
      local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
      local_68 = this_00;
      do {
        pvVar3 = memchr(__s.values_,0x2b,__n_00);
        uVar5 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)__s;
        if (uVar5 == 0xffffffffffffffff) {
          aVar9.values_ = (value<fmt::v11::context> *)0x0;
          uVar5 = __n_00;
          __n_00 = 0;
        }
        else {
          lVar8 = uVar5 + 1;
          if (__n_00 <= uVar5) goto LAB_001e3e98;
          aVar9.values_ = (value<fmt::v11::context> *)((long)&(__s.values_)->field_0 + lVar8);
          __n_00 = __n_00 - lVar8;
        }
        name._M_str = (char *)local_60;
        name._M_len = uVar6;
        value._M_str = (char *)__s.values_;
        value._M_len = uVar5;
        Option::set_abi_cxx11_(&local_a8,local_68,name,value,(bool)(bVar2 & 1));
        if (local_a8._M_string_length != 0) {
          local_88._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
          local_88._M_string_length = (this->programName)._M_string_length;
          local_88.field_2._M_allocated_capacity = (size_type)local_a8._M_dataplus._M_p;
          local_88.field_2._8_8_ = local_a8._M_string_length;
          fmt.size_ = 0xdd;
          fmt.data_ = (char *)0x6;
          args.field_1.values_ = __s.values_;
          args.desc_ = (unsigned_long_long)&local_88;
          ::fmt::v11::vformat_abi_cxx11_(&local_50,(v11 *)"{}: {}",fmt,args);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_58,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          (size_t)(local_a8.field_2._M_allocated_capacity + 1));
        }
        __s = aVar9;
        if (__n_00 == 0) {
          return;
        }
      } while( true );
    }
    if (*(__index_type *)
         ((long)&(this_00->storage).
                 super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                 .
                 super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                 .
                 super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
         + 0x20) == '\0') {
      name_00._M_str = (char *)local_60;
      name_00._M_len = uVar6;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = __s;
      Option::set_abi_cxx11_
                (&local_88,this_00,name_00,(string_view)(auVar1 << 0x40),(bool)(bVar2 & 1));
      local_a8.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
      local_a8._M_dataplus._M_p = local_88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) {
        return;
      }
      goto LAB_001e3e39;
    }
    local_88._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
    local_88._M_string_length = (this->programName)._M_string_length;
    local_88.field_2._M_allocated_capacity = (size_type)local_60;
    fmt_01.size_ = 0xdd;
    fmt_01.data_ = (char *)0x27;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_88;
    local_88.field_2._8_8_ = uVar6;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_a8,(v11 *)"{}: no value provided for argument \'{}\'",fmt_01,args_01);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return;
  }
LAB_001e3e39:
  operator_delete(local_a8._M_dataplus._M_p,(size_t)(local_a8.field_2._M_allocated_capacity + 1));
  return;
}

Assistant:

void CommandLine::handlePlusArg(std::string_view arg, ParseOptions options, bool& hadUnknowns) {
    // Values are plus separated.
    std::string_view value;
    size_t idx = arg.find_first_of('+', 2);
    if (idx != std::string_view::npos) {
        value = arg.substr(idx + 1);
        arg = arg.substr(0, idx);
    }

    auto it = optionMap.find(std::string(arg));
    if (it == optionMap.end()) {
        hadUnknowns = true;
        errors.emplace_back(
            fmt::format("{}: unknown command line argument '{}'"sv, programName, arg));
        return;
    }

    auto option = it->second.get();
    if (value.empty()) {
        if (option->expectsValue()) {
            errors.emplace_back(
                fmt::format("{}: no value provided for argument '{}'"sv, programName, arg));
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            SLANG_ASSERT(result.empty());
        }
        return;
    }

    do {
        std::string_view curr = value;
        idx = value.find_first_of('+');
        if (idx != std::string_view::npos) {
            value = value.substr(idx + 1);
            curr = curr.substr(0, idx);
        }
        else {
            value = {};
        }

        std::string result = option->set(arg, curr, options.ignoreDuplicates);
        if (!result.empty())
            errors.emplace_back(fmt::format("{}: {}", programName, result));

    } while (!value.empty());
}